

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ZSTD_compressionParameters *cParams;
  int *iEnd;
  int *piVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  U32 *pUVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  U32 UVar14;
  U32 UVar15;
  BYTE *iStart;
  int *ilimit_w;
  size_t sVar16;
  ulong uVar17;
  BYTE *pBVar18;
  int *piVar19;
  BYTE *pBVar20;
  BYTE *pBVar21;
  int *piVar22;
  uint uVar23;
  U32 val;
  long lVar24;
  int *piVar25;
  int *piVar26;
  ulong uVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  seqDef *psVar32;
  bool bVar33;
  int *local_128;
  ulong local_110;
  U32 local_ec;
  ulong local_e8;
  int *local_d8;
  U32 local_b0;
  ulong local_a8;
  
  iEnd = (int *)((long)src + srcSize);
  piVar1 = (int *)((long)src + (srcSize - 8));
  pBVar5 = (ms->window).base;
  pBVar6 = (ms->window).dictBase;
  uVar3 = (ms->window).dictLimit;
  uVar4 = (ms->window).lowLimit;
  iStart = pBVar5 + uVar3;
  piVar25 = (int *)(pBVar6 + uVar3);
  local_128 = (int *)((ulong)(iStart == (BYTE *)src) + (long)src);
  ilimit_w = (int *)((long)src + (srcSize - 0x20));
  local_ec = *rep;
  local_b0 = rep[1];
  iVar9 = uVar3 - 1;
  cParams = &ms->cParams;
LAB_00121eb2:
  do {
    if (piVar1 <= local_128) {
      *rep = local_ec;
      rep[1] = local_b0;
      return (long)iEnd - (long)src;
    }
    iVar28 = (int)local_128;
    iVar10 = iVar28 - (int)pBVar5;
    uVar11 = (iVar10 - local_ec) + 1;
    pBVar18 = pBVar5;
    if (uVar11 < uVar3) {
      pBVar18 = pBVar6;
    }
    if ((uVar4 < uVar11 && 2 < iVar9 - uVar11) &&
       (*(int *)((long)local_128 + 1) == *(int *)(pBVar18 + uVar11))) {
      piVar22 = iEnd;
      if (uVar11 < uVar3) {
        piVar22 = piVar25;
      }
      sVar16 = ZSTD_count_2segments
                         ((BYTE *)((long)local_128 + 5),(BYTE *)((long)(pBVar18 + uVar11) + 4),
                          (BYTE *)iEnd,(BYTE *)piVar22,iStart);
      local_a8 = sVar16 + 4;
    }
    else {
      local_a8 = 0;
    }
    uVar11 = (ms->cParams).minMatch;
    if (uVar11 - 6 < 2) {
      uVar12 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
      pUVar7 = ms->chainTable;
      pBVar18 = (ms->window).base;
      pBVar21 = (ms->window).dictBase;
      uVar11 = (ms->window).dictLimit;
      uVar30 = iVar28 - (int)pBVar18;
      uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      UVar14 = (ms->window).lowLimit;
      UVar15 = uVar30 - uVar23;
      if (uVar30 - UVar14 <= uVar23) {
        UVar15 = UVar14;
      }
      if (ms->loadedDictEnd != 0) {
        UVar15 = UVar14;
      }
      uVar23 = uVar30 - uVar12;
      if (uVar30 < uVar12) {
        uVar23 = 0;
      }
      iVar28 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      uVar13 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)local_128,6);
      local_110 = 999999999;
      uVar27 = 3;
      while( true ) {
        bVar33 = iVar28 == 0;
        iVar28 = iVar28 + -1;
        if ((uVar13 <= UVar15) || (bVar33)) break;
        if (uVar13 < uVar11) {
          if (pBVar21 + uVar11 < pBVar21 + (ulong)uVar13 + 4) {
LAB_00123580:
            __assert_fail("match+4 <= dictEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x40dd,
                          "size_t ZSTD_HcFindBestMatch_generic(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                         );
          }
          if (*(int *)(pBVar21 + uVar13) == *local_128) {
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)(local_128 + 1),pBVar21 + (ulong)uVar13 + 4,(BYTE *)iEnd,
                                pBVar21 + uVar11,pBVar18 + uVar11);
            uVar17 = sVar16 + 4;
LAB_001220c4:
            if ((uVar27 < uVar17) &&
               (local_110 = (ulong)((uVar30 + 2) - uVar13), uVar27 = uVar17,
               (int *)((long)local_128 + uVar17) == iEnd)) break;
          }
        }
        else if ((pBVar18 + uVar13)[uVar27] == *(BYTE *)((long)local_128 + uVar27)) {
          uVar17 = ZSTD_count((BYTE *)local_128,pBVar18 + uVar13,(BYTE *)iEnd);
          goto LAB_001220c4;
        }
        if (uVar13 <= uVar23) break;
        uVar13 = pUVar7[uVar13 & uVar12 - 1];
      }
    }
    else if (uVar11 == 5) {
      uVar12 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
      pUVar7 = ms->chainTable;
      pBVar18 = (ms->window).base;
      pBVar21 = (ms->window).dictBase;
      uVar11 = (ms->window).dictLimit;
      uVar30 = iVar28 - (int)pBVar18;
      uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      UVar14 = (ms->window).lowLimit;
      UVar15 = uVar30 - uVar23;
      if (uVar30 - UVar14 <= uVar23) {
        UVar15 = UVar14;
      }
      if (ms->loadedDictEnd != 0) {
        UVar15 = UVar14;
      }
      uVar23 = uVar30 - uVar12;
      if (uVar30 < uVar12) {
        uVar23 = 0;
      }
      iVar28 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      uVar13 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)local_128,5);
      local_110 = 999999999;
      uVar27 = 3;
      while( true ) {
        bVar33 = iVar28 == 0;
        iVar28 = iVar28 + -1;
        if ((uVar13 <= UVar15) || (bVar33)) break;
        if (uVar13 < uVar11) {
          if (pBVar21 + uVar11 < pBVar21 + (ulong)uVar13 + 4) goto LAB_00123580;
          if (*(int *)(pBVar21 + uVar13) == *local_128) {
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)(local_128 + 1),pBVar21 + (ulong)uVar13 + 4,(BYTE *)iEnd,
                                pBVar21 + uVar11,pBVar18 + uVar11);
            uVar17 = sVar16 + 4;
LAB_00122252:
            if ((uVar27 < uVar17) &&
               (local_110 = (ulong)((uVar30 + 2) - uVar13), uVar27 = uVar17,
               (int *)((long)local_128 + uVar17) == iEnd)) break;
          }
        }
        else if ((pBVar18 + uVar13)[uVar27] == *(BYTE *)((long)local_128 + uVar27)) {
          uVar17 = ZSTD_count((BYTE *)local_128,pBVar18 + uVar13,(BYTE *)iEnd);
          goto LAB_00122252;
        }
        if (uVar13 <= uVar23) break;
        uVar13 = pUVar7[uVar13 & uVar12 - 1];
      }
    }
    else {
      uVar12 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
      pUVar7 = ms->chainTable;
      pBVar18 = (ms->window).base;
      pBVar21 = (ms->window).dictBase;
      uVar11 = (ms->window).dictLimit;
      uVar30 = iVar28 - (int)pBVar18;
      uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      UVar14 = (ms->window).lowLimit;
      UVar15 = uVar30 - uVar23;
      if (uVar30 - UVar14 <= uVar23) {
        UVar15 = UVar14;
      }
      if (ms->loadedDictEnd != 0) {
        UVar15 = UVar14;
      }
      uVar23 = uVar30 - uVar12;
      if (uVar30 < uVar12) {
        uVar23 = 0;
      }
      iVar28 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      uVar13 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)local_128,4);
      local_110 = 999999999;
      uVar27 = 3;
      while( true ) {
        bVar33 = iVar28 == 0;
        iVar28 = iVar28 + -1;
        if ((uVar13 <= UVar15) || (bVar33)) break;
        if (uVar13 < uVar11) {
          if (pBVar21 + uVar11 < pBVar21 + (ulong)uVar13 + 4) goto LAB_00123580;
          if (*(int *)(pBVar21 + uVar13) == *local_128) {
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)(local_128 + 1),pBVar21 + (ulong)uVar13 + 4,(BYTE *)iEnd,
                                pBVar21 + uVar11,pBVar18 + uVar11);
            uVar17 = sVar16 + 4;
LAB_001223d8:
            if ((uVar27 < uVar17) &&
               (local_110 = (ulong)((uVar30 + 2) - uVar13), uVar27 = uVar17,
               (int *)((long)local_128 + uVar17) == iEnd)) break;
          }
        }
        else if ((pBVar18 + uVar13)[uVar27] == *(BYTE *)((long)local_128 + uVar27)) {
          uVar17 = ZSTD_count((BYTE *)local_128,pBVar18 + uVar13,(BYTE *)iEnd);
          goto LAB_001223d8;
        }
        if (uVar13 <= uVar23) break;
        uVar13 = pUVar7[uVar13 & uVar12 - 1];
      }
    }
    uVar17 = local_a8;
    if (local_a8 < uVar27) {
      uVar17 = uVar27;
    }
    if (uVar17 < 4) {
      local_128 = (int *)((long)local_128 + ((long)local_128 - (long)src >> 8) + 1);
      goto LAB_00121eb2;
    }
    piVar22 = local_128;
    if (uVar27 <= local_a8) {
      local_110 = 0;
      local_128 = (int *)((long)local_128 + 1);
    }
    while (iVar28 = iVar10, uVar27 = uVar17, piVar26 = piVar22, local_e8 = local_110,
          piVar26 < piVar1) {
      piVar22 = (int *)((long)piVar26 + 1);
      iVar10 = iVar28 + 1;
      if (local_110 == 0) {
        local_d8 = local_128;
        local_e8 = 0;
      }
      else {
        uVar11 = iVar10 - local_ec;
        pBVar18 = pBVar5;
        if (uVar11 < uVar3) {
          pBVar18 = pBVar6;
        }
        if ((uVar4 < uVar11 && 2 < iVar9 - uVar11) && (*piVar22 == *(int *)(pBVar18 + uVar11))) {
          piVar19 = iEnd;
          if (uVar11 < uVar3) {
            piVar19 = piVar25;
          }
          sVar16 = ZSTD_count_2segments
                             ((BYTE *)((long)piVar26 + 5),(BYTE *)((long)(pBVar18 + uVar11) + 4),
                              (BYTE *)iEnd,(BYTE *)piVar19,iStart);
          UVar14 = ZSTD_highbit32((int)local_110 + 1);
          if (sVar16 < 0xfffffffffffffffc) {
            local_d8 = local_128;
            if ((int)(((int)uVar27 * 3 - UVar14) + 1) < (int)(sVar16 + 4) * 3) {
              local_e8 = 0;
              uVar27 = sVar16 + 4;
              local_d8 = piVar22;
            }
          }
          else {
            local_d8 = local_128;
          }
        }
        else {
          local_d8 = local_128;
        }
      }
      uVar11 = (ms->cParams).minMatch;
      iVar31 = (int)piVar22;
      if (uVar11 - 6 < 2) {
        uVar30 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar7 = ms->chainTable;
        pBVar18 = (ms->window).base;
        pBVar21 = (ms->window).dictBase;
        uVar11 = (ms->window).dictLimit;
        uVar29 = iVar31 - (int)pBVar18;
        uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar12 = (ms->window).lowLimit;
        uVar23 = uVar29 - uVar13;
        if (uVar29 - uVar12 <= uVar13) {
          uVar23 = uVar12;
        }
        if (ms->loadedDictEnd != 0) {
          uVar23 = uVar12;
        }
        uVar12 = uVar29 - uVar30;
        if (uVar29 < uVar30) {
          uVar12 = 0;
        }
        iVar31 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        uVar13 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)piVar22,6);
        local_110 = 999999999;
        uVar17 = 3;
        while( true ) {
          bVar33 = iVar31 == 0;
          iVar31 = iVar31 + -1;
          if ((uVar13 <= uVar23) || (bVar33)) break;
          if (uVar13 < uVar11) {
            if (pBVar21 + uVar11 < pBVar21 + (ulong)uVar13 + 4) goto LAB_00123580;
            if (*(int *)(pBVar21 + uVar13) == *piVar22) {
              sVar16 = ZSTD_count_2segments
                                 ((BYTE *)((long)piVar26 + 5),pBVar21 + (ulong)uVar13 + 4,
                                  (BYTE *)iEnd,pBVar21 + uVar11,pBVar18 + uVar11);
              sVar16 = sVar16 + 4;
LAB_0012271d:
              if ((uVar17 < sVar16) &&
                 (local_110 = (ulong)((uVar29 + 2) - uVar13), uVar17 = sVar16,
                 (int *)((long)piVar22 + sVar16) == iEnd)) break;
            }
          }
          else if ((pBVar18 + uVar13)[uVar17] == *(BYTE *)((long)piVar22 + uVar17)) {
            sVar16 = ZSTD_count((BYTE *)piVar22,pBVar18 + uVar13,(BYTE *)iEnd);
            goto LAB_0012271d;
          }
          if (uVar13 <= uVar12) break;
          uVar13 = pUVar7[uVar13 & uVar30 - 1];
        }
      }
      else if (uVar11 == 5) {
        uVar30 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar7 = ms->chainTable;
        pBVar18 = (ms->window).base;
        pBVar21 = (ms->window).dictBase;
        uVar11 = (ms->window).dictLimit;
        uVar29 = iVar31 - (int)pBVar18;
        uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar12 = (ms->window).lowLimit;
        uVar23 = uVar29 - uVar13;
        if (uVar29 - uVar12 <= uVar13) {
          uVar23 = uVar12;
        }
        if (ms->loadedDictEnd != 0) {
          uVar23 = uVar12;
        }
        uVar12 = uVar29 - uVar30;
        if (uVar29 < uVar30) {
          uVar12 = 0;
        }
        iVar31 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        uVar13 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)piVar22,5);
        local_110 = 999999999;
        uVar17 = 3;
        while( true ) {
          bVar33 = iVar31 == 0;
          iVar31 = iVar31 + -1;
          if ((uVar13 <= uVar23) || (bVar33)) break;
          if (uVar13 < uVar11) {
            if (pBVar21 + uVar11 < pBVar21 + (ulong)uVar13 + 4) goto LAB_00123580;
            if (*(int *)(pBVar21 + uVar13) == *piVar22) {
              sVar16 = ZSTD_count_2segments
                                 ((BYTE *)((long)piVar26 + 5),pBVar21 + (ulong)uVar13 + 4,
                                  (BYTE *)iEnd,pBVar21 + uVar11,pBVar18 + uVar11);
              sVar16 = sVar16 + 4;
LAB_001228c6:
              if ((uVar17 < sVar16) &&
                 (local_110 = (ulong)((uVar29 + 2) - uVar13), uVar17 = sVar16,
                 (int *)((long)piVar22 + sVar16) == iEnd)) break;
            }
          }
          else if ((pBVar18 + uVar13)[uVar17] == *(BYTE *)((long)piVar22 + uVar17)) {
            sVar16 = ZSTD_count((BYTE *)piVar22,pBVar18 + uVar13,(BYTE *)iEnd);
            goto LAB_001228c6;
          }
          if (uVar13 <= uVar12) break;
          uVar13 = pUVar7[uVar13 & uVar30 - 1];
        }
      }
      else {
        uVar30 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar7 = ms->chainTable;
        pBVar18 = (ms->window).base;
        pBVar21 = (ms->window).dictBase;
        uVar11 = (ms->window).dictLimit;
        uVar29 = iVar31 - (int)pBVar18;
        uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar12 = (ms->window).lowLimit;
        uVar23 = uVar29 - uVar13;
        if (uVar29 - uVar12 <= uVar13) {
          uVar23 = uVar12;
        }
        if (ms->loadedDictEnd != 0) {
          uVar23 = uVar12;
        }
        uVar12 = uVar29 - uVar30;
        if (uVar29 < uVar30) {
          uVar12 = 0;
        }
        iVar31 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        uVar13 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)piVar22,4);
        local_110 = 999999999;
        uVar17 = 3;
        while( true ) {
          bVar33 = iVar31 == 0;
          iVar31 = iVar31 + -1;
          if ((uVar13 <= uVar23) || (bVar33)) break;
          if (uVar13 < uVar11) {
            if (pBVar21 + uVar11 < pBVar21 + (ulong)uVar13 + 4) goto LAB_00123580;
            if (*(int *)(pBVar21 + uVar13) == *piVar22) {
              sVar16 = ZSTD_count_2segments
                                 ((BYTE *)((long)piVar26 + 5),pBVar21 + (ulong)uVar13 + 4,
                                  (BYTE *)iEnd,pBVar21 + uVar11,pBVar18 + uVar11);
              sVar16 = sVar16 + 4;
LAB_00122a66:
              if ((uVar17 < sVar16) &&
                 (local_110 = (ulong)((uVar29 + 2) - uVar13), uVar17 = sVar16,
                 (int *)((long)piVar22 + sVar16) == iEnd)) break;
            }
          }
          else if ((pBVar18 + uVar13)[uVar17] == *(BYTE *)((long)piVar22 + uVar17)) {
            sVar16 = ZSTD_count((BYTE *)piVar22,pBVar18 + uVar13,(BYTE *)iEnd);
            goto LAB_00122a66;
          }
          if (uVar13 <= uVar12) break;
          uVar13 = pUVar7[uVar13 & uVar30 - 1];
        }
      }
      UVar14 = ZSTD_highbit32((int)local_110 + 1);
      val = (int)local_e8 + 1;
      UVar15 = ZSTD_highbit32(val);
      if ((uVar17 < 4) ||
         (local_128 = piVar22,
         (int)((int)uVar17 * 4 - UVar14) <= (int)(((int)uVar27 * 4 - UVar15) + 4))) {
        if (piVar1 <= piVar22) goto LAB_00123193;
        piVar22 = (int *)((long)piVar26 + 2);
        iVar10 = iVar28 + 2;
        if (local_e8 == 0) {
          local_e8 = 0;
        }
        else {
          uVar11 = iVar10 - local_ec;
          pBVar18 = pBVar5;
          if (uVar11 < uVar3) {
            pBVar18 = pBVar6;
          }
          if ((uVar4 < uVar11 && 2 < iVar9 - uVar11) && (*piVar22 == *(int *)(pBVar18 + uVar11))) {
            piVar19 = iEnd;
            if (uVar11 < uVar3) {
              piVar19 = piVar25;
            }
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)piVar26 + 6),(BYTE *)((long)(pBVar18 + uVar11) + 4),
                                (BYTE *)iEnd,(BYTE *)piVar19,iStart);
            UVar14 = ZSTD_highbit32(val);
            if ((sVar16 < 0xfffffffffffffffc) &&
               ((int)(((int)uVar27 * 4 + 1) - UVar14) < (int)(sVar16 + 4) * 4)) {
              local_e8 = 0;
              uVar27 = sVar16 + 4;
              local_d8 = piVar22;
            }
          }
        }
        uVar11 = (ms->cParams).minMatch;
        iVar28 = (int)piVar22;
        if (uVar11 - 6 < 2) {
          uVar12 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
          pUVar7 = ms->chainTable;
          pBVar18 = (ms->window).base;
          pBVar21 = (ms->window).dictBase;
          uVar11 = (ms->window).dictLimit;
          uVar30 = iVar28 - (int)pBVar18;
          uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          UVar14 = (ms->window).lowLimit;
          UVar15 = uVar30 - uVar23;
          if (uVar30 - UVar14 <= uVar23) {
            UVar15 = UVar14;
          }
          if (ms->loadedDictEnd != 0) {
            UVar15 = UVar14;
          }
          uVar23 = uVar30 - uVar12;
          if (uVar30 < uVar12) {
            uVar23 = 0;
          }
          iVar28 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          UVar14 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)piVar22,6);
          local_110 = 999999999;
          uVar17 = 3;
          while( true ) {
            bVar33 = iVar28 == 0;
            iVar28 = iVar28 + -1;
            if ((UVar14 <= UVar15) || (bVar33)) break;
            if (UVar14 < uVar11) {
              if (pBVar21 + uVar11 < pBVar21 + (ulong)UVar14 + 4) goto LAB_00123580;
              if (*(int *)(pBVar21 + UVar14) == *piVar22) {
                sVar16 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar26 + 6),pBVar21 + (ulong)UVar14 + 4,
                                    (BYTE *)iEnd,pBVar21 + uVar11,pBVar18 + uVar11);
                sVar16 = sVar16 + 4;
LAB_00122d70:
                if ((uVar17 < sVar16) &&
                   (local_110 = (ulong)((uVar30 + 2) - UVar14), uVar17 = sVar16,
                   (int *)((long)piVar22 + sVar16) == iEnd)) break;
              }
            }
            else if ((pBVar18 + UVar14)[uVar17] == *(BYTE *)((long)piVar22 + uVar17)) {
              sVar16 = ZSTD_count((BYTE *)piVar22,pBVar18 + UVar14,(BYTE *)iEnd);
              goto LAB_00122d70;
            }
            if (UVar14 <= uVar23) break;
            UVar14 = pUVar7[UVar14 & uVar12 - 1];
          }
        }
        else if (uVar11 == 5) {
          uVar12 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
          pUVar7 = ms->chainTable;
          pBVar18 = (ms->window).base;
          pBVar21 = (ms->window).dictBase;
          uVar11 = (ms->window).dictLimit;
          uVar30 = iVar28 - (int)pBVar18;
          uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          UVar14 = (ms->window).lowLimit;
          UVar15 = uVar30 - uVar23;
          if (uVar30 - UVar14 <= uVar23) {
            UVar15 = UVar14;
          }
          if (ms->loadedDictEnd != 0) {
            UVar15 = UVar14;
          }
          uVar23 = uVar30 - uVar12;
          if (uVar30 < uVar12) {
            uVar23 = 0;
          }
          iVar28 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          UVar14 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)piVar22,5);
          local_110 = 999999999;
          uVar17 = 3;
          while( true ) {
            bVar33 = iVar28 == 0;
            iVar28 = iVar28 + -1;
            if ((UVar14 <= UVar15) || (bVar33)) break;
            if (UVar14 < uVar11) {
              if (pBVar21 + uVar11 < pBVar21 + (ulong)UVar14 + 4) goto LAB_00123580;
              if (*(int *)(pBVar21 + UVar14) == *piVar22) {
                sVar16 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar26 + 6),pBVar21 + (ulong)UVar14 + 4,
                                    (BYTE *)iEnd,pBVar21 + uVar11,pBVar18 + uVar11);
                sVar16 = sVar16 + 4;
LAB_00122f0f:
                if ((uVar17 < sVar16) &&
                   (local_110 = (ulong)((uVar30 + 2) - UVar14), uVar17 = sVar16,
                   (int *)((long)piVar22 + sVar16) == iEnd)) break;
              }
            }
            else if ((pBVar18 + UVar14)[uVar17] == *(BYTE *)((long)piVar22 + uVar17)) {
              sVar16 = ZSTD_count((BYTE *)piVar22,pBVar18 + UVar14,(BYTE *)iEnd);
              goto LAB_00122f0f;
            }
            if (UVar14 <= uVar23) break;
            UVar14 = pUVar7[UVar14 & uVar12 - 1];
          }
        }
        else {
          uVar12 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
          pUVar7 = ms->chainTable;
          pBVar18 = (ms->window).base;
          pBVar21 = (ms->window).dictBase;
          uVar11 = (ms->window).dictLimit;
          uVar30 = iVar28 - (int)pBVar18;
          uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          UVar14 = (ms->window).lowLimit;
          UVar15 = uVar30 - uVar23;
          if (uVar30 - UVar14 <= uVar23) {
            UVar15 = UVar14;
          }
          if (ms->loadedDictEnd != 0) {
            UVar15 = UVar14;
          }
          uVar23 = uVar30 - uVar12;
          if (uVar30 < uVar12) {
            uVar23 = 0;
          }
          iVar28 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          UVar14 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)piVar22,4);
          local_110 = 999999999;
          uVar17 = 3;
          while( true ) {
            bVar33 = iVar28 == 0;
            iVar28 = iVar28 + -1;
            if ((UVar14 <= UVar15) || (bVar33)) break;
            if (UVar14 < uVar11) {
              if (pBVar21 + uVar11 < pBVar21 + (ulong)UVar14 + 4) goto LAB_00123580;
              if (*(int *)(pBVar21 + UVar14) == *piVar22) {
                sVar16 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar26 + 6),pBVar21 + (ulong)UVar14 + 4,
                                    (BYTE *)iEnd,pBVar21 + uVar11,pBVar18 + uVar11);
                sVar16 = sVar16 + 4;
LAB_001230a5:
                if ((uVar17 < sVar16) &&
                   (local_110 = (ulong)((uVar30 + 2) - UVar14), uVar17 = sVar16,
                   (int *)((long)piVar22 + sVar16) == iEnd)) break;
              }
            }
            else if ((pBVar18 + UVar14)[uVar17] == *(BYTE *)((long)piVar22 + uVar17)) {
              sVar16 = ZSTD_count((BYTE *)piVar22,pBVar18 + UVar14,(BYTE *)iEnd);
              goto LAB_001230a5;
            }
            if (UVar14 <= uVar23) break;
            UVar14 = pUVar7[UVar14 & uVar12 - 1];
          }
        }
        UVar14 = ZSTD_highbit32((int)local_110 + 1);
        UVar15 = ZSTD_highbit32((int)local_e8 + 1);
        if ((uVar17 < 4) ||
           (local_128 = piVar22,
           (int)((int)uVar17 * 4 - UVar14) <= (int)(((int)uVar27 * 4 - UVar15) + 7)))
        goto LAB_00123193;
      }
    }
    local_d8 = local_128;
LAB_00123193:
    if (local_e8 == 0) {
      UVar14 = 1;
    }
    else {
      pBVar20 = (BYTE *)((long)local_d8 + (-(long)pBVar5 - local_e8) + 2);
      pBVar21 = iStart;
      pBVar18 = pBVar5;
      if ((uint)pBVar20 < uVar3) {
        pBVar21 = pBVar6 + uVar4;
        pBVar18 = pBVar6;
      }
      pBVar18 = pBVar18 + ((ulong)pBVar20 & 0xffffffff);
      for (; ((src < local_d8 && (pBVar21 < pBVar18)) &&
             (*(BYTE *)((long)local_d8 + -1) == pBVar18[-1]));
          local_d8 = (int *)((long)local_d8 + -1)) {
        pBVar18 = pBVar18 + -1;
        uVar27 = uVar27 + 1;
      }
      UVar14 = (int)local_e8 + 1;
      local_b0 = local_ec;
      local_ec = (int)local_e8 - 2;
    }
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0012359f:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2038,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
LAB_001235dd:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203a,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar17 = (long)local_d8 - (long)src;
    pBVar18 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar18 + uVar17) {
LAB_001235fc:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < local_d8) {
LAB_001235be:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203c,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (ilimit_w < local_d8) {
      ZSTD_safecopyLiterals(pBVar18,(BYTE *)src,(BYTE *)local_d8,(BYTE *)ilimit_w);
LAB_001232a8:
      seqStore->lit = seqStore->lit + uVar17;
      if (0xffff < uVar17) {
        if (seqStore->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x204d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthID = 1;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar8 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar18 = *src;
      *(undefined8 *)(pBVar18 + 8) = uVar8;
      pBVar18 = seqStore->lit;
      if (0x10 < uVar17) {
        lVar24 = (long)(pBVar18 + 0x10) - ((long)src + 0x10);
        if (lVar24 < 8) {
          if (-0x10 < lVar24) {
            __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1268,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
        }
        else if (0xffffffffffffffe0 < lVar24 - 0x10U) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x1270,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar8 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar18 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar18 + 0x18) = uVar8;
        if (0x20 < (long)uVar17) {
          lVar24 = 0;
          do {
            puVar2 = (undefined8 *)((long)src + lVar24 + 0x20);
            uVar8 = puVar2[1];
            pBVar21 = pBVar18 + lVar24 + 0x20;
            *(undefined8 *)pBVar21 = *puVar2;
            *(undefined8 *)(pBVar21 + 8) = uVar8;
            puVar2 = (undefined8 *)((long)src + lVar24 + 0x30);
            uVar8 = puVar2[1];
            *(undefined8 *)(pBVar21 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar21 + 0x18) = uVar8;
            lVar24 = lVar24 + 0x20;
          } while (pBVar21 + 0x20 < pBVar18 + uVar17);
        }
        goto LAB_001232a8;
      }
      seqStore->lit = pBVar18 + uVar17;
    }
    psVar32 = seqStore->sequences;
    psVar32->litLength = (U16)uVar17;
    psVar32->offset = UVar14;
    if (0xffff < uVar27 - 3) {
      if (seqStore->longLengthID != 0) {
LAB_0012361b:
        __assert_fail("seqStorePtr->longLengthID == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2058,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthID = 2;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar32 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar32->matchLength = (U16)(uVar27 - 3);
    psVar32 = psVar32 + 1;
    seqStore->sequences = psVar32;
    UVar14 = local_b0;
    for (local_128 = (int *)((long)local_d8 + uVar27); local_b0 = UVar14, src = local_128,
        local_128 <= piVar1; local_128 = (int *)((long)local_128 + sVar16 + 4)) {
      uVar11 = (uint)((long)local_128 - (long)(pBVar5 + local_b0));
      pBVar18 = pBVar5;
      if (uVar11 < uVar3) {
        pBVar18 = pBVar6;
      }
      if (((uVar11 <= uVar4) || (iVar9 - uVar11 < 3)) ||
         (*local_128 !=
          *(int *)(pBVar18 + ((long)local_128 - (long)(pBVar5 + local_b0) & 0xffffffff)))) break;
      piVar22 = iEnd;
      if (uVar11 < uVar3) {
        piVar22 = piVar25;
      }
      sVar16 = ZSTD_count_2segments
                         ((BYTE *)(local_128 + 1),
                          (BYTE *)((long)(pBVar18 +
                                         ((long)local_128 - (long)(pBVar5 + local_b0) & 0xffffffff))
                                  + 4),(BYTE *)iEnd,(BYTE *)piVar22,iStart);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar32 - (long)seqStore->sequencesStart >> 3))
      goto LAB_0012359f;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001235dd;
      pBVar18 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar18) goto LAB_001235fc;
      if (iEnd < local_128) goto LAB_001235be;
      if (ilimit_w < local_128) {
        ZSTD_safecopyLiterals(pBVar18,(BYTE *)local_128,(BYTE *)local_128,(BYTE *)ilimit_w);
      }
      else {
        uVar8 = *(undefined8 *)(local_128 + 2);
        *(undefined8 *)pBVar18 = *(undefined8 *)local_128;
        *(undefined8 *)(pBVar18 + 8) = uVar8;
      }
      psVar32 = seqStore->sequences;
      psVar32->litLength = 0;
      psVar32->offset = 1;
      if (0xffff < sVar16 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_0012361b;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar32 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar32->matchLength = (U16)(sVar16 + 1);
      psVar32 = psVar32 + 1;
      seqStore->sequences = psVar32;
      UVar14 = local_ec;
      local_ec = local_b0;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 2);
}